

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O3

int Pla_ManDist1NumTest(Pla_Man_t *p)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_20;
  
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_20.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_20.tv_sec * -1000000;
  }
  uVar2 = Pla_ManDist1Num(p);
  printf("Found %d pairs among %d cubes using cube pair enumeration.  ",(ulong)uVar2,
         (ulong)(uint)(p->vCubes).nSize);
  level = 3;
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  return 1;
}

Assistant:

int Pla_ManDist1NumTest( Pla_Man_t * p )
{
    abctime clk = Abc_Clock();
    int Count = Pla_ManDist1Num( p );
    printf( "Found %d pairs among %d cubes using cube pair enumeration.  ", Count, Pla_ManCubeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 1;
}